

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O2

int __thiscall P2PSocket::connect(P2PSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  char *__rhs;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = Peers::connect(&this->m_peers,__fd,(sockaddr *)((ulong)__addr & 0xffff),__len);
  if ((char)iVar1 != '\0') {
    return iVar1;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  std::operator+(&local_98,"Failed to connect to: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,__fd));
  std::operator+(&local_78,&local_98," ");
  std::__cxx11::to_string(&local_b8,(int)__addr);
  std::operator+(&local_58,&local_78,&local_b8);
  std::operator+(&local_38,&local_58," ");
  piVar3 = __errno_location();
  __rhs = strerror(*piVar3);
  std::operator+(&local_d8,&local_38,__rhs);
  *plVar2 = (long)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    *(undefined4 *)(plVar2 + 2) = local_d8.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)plVar2 + 0x14) = local_d8.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(plVar2 + 3) = local_d8.field_2._8_4_;
    *(undefined4 *)((long)plVar2 + 0x1c) = local_d8.field_2._12_4_;
  }
  else {
    *plVar2 = (long)local_d8._M_dataplus._M_p;
    plVar2[2] = CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                         local_d8.field_2._M_allocated_capacity._0_4_);
  }
  plVar2[1] = local_d8._M_string_length;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity._0_4_ =
       local_d8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  __cxa_throw(plVar2,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

void P2PSocket::connect(const std::string &remotePeerAddress, int port)
{
    if (!this->m_peers.connect(remotePeerAddress, port)) {
        throw P2PSocketException(std::string{"Failed to connect to: " + remotePeerAddress + " " +
                                             std::to_string(port) + " "} +
                                 std::strerror(errno));
    }
}